

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

string * base64_encode_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *input)

{
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  byte *pbVar4;
  array<unsigned_char,_3UL> input_buffer;
  array<unsigned_char,_4UL> output_buffer;
  byte local_30 [4];
  undefined4 local_2c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  uVar3 = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_30[2] = 0;
  local_30[0] = 0;
  local_30[1] = 0;
  local_2c = 0;
  pbVar4 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar1 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      lVar2 = (long)(int)uVar3;
      uVar3 = uVar3 + 1;
      local_30[lVar2] = *pbVar4;
      if (uVar3 == 3) {
        local_2c._0_2_ = CONCAT11((local_30[0] & 3) << 4 | local_30[1] >> 4,local_30[0] >> 2);
        local_2c._0_3_ = CONCAT12((local_30[1] & 0xf) << 2 | local_30[2] >> 6,(undefined2)local_2c);
        local_2c = CONCAT13(local_30[2],(undefined3)local_2c) & 0x3fffffff;
        lVar2 = 0;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,
                     base64_chars_abi_cxx11_._M_dataplus._M_p[*(byte *)((long)&local_2c + lVar2)]);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        pbVar1 = (input->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar3 = 0;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
    if (uVar3 != 0) {
      if (uVar3 < 3) {
        memset(local_30 + uVar3,0,3 - (ulong)uVar3);
      }
      local_2c._0_2_ = CONCAT11((local_30[0] & 3) << 4 | local_30[1] >> 4,local_30[0] >> 2);
      local_2c._0_3_ = CONCAT12((local_30[1] & 0xf) << 2 | local_30[2] >> 6,(undefined2)local_2c);
      local_2c = CONCAT13(local_30[2],(undefined3)local_2c) & 0x3fffffff;
      if (uVar3 + 1 != 0) {
        lVar2 = 0;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,
                     base64_chars_abi_cxx11_._M_dataplus._M_p[*(byte *)((long)&local_2c + lVar2)]);
          lVar2 = lVar2 + 1;
        } while ((int)(uVar3 + 1) != lVar2);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(const std::vector<uint8_t>& input)
{
    std::string encoded;
    std::array<uint8_t, 3> input_buffer {};
    std::array<uint8_t, 4> output_buffer {};

    int i = 0;
    auto it = input.begin();
    while(it != input.end())
    {
        input_buffer[i++] = *(it++);
        if (i == input_buffer.size())
        {
            output_buffer[0] = (input_buffer[0] & 0xfc) >> 2;
            output_buffer[1] = ((input_buffer[0] & 0x03) << 4) + ((input_buffer[1] & 0xf0) >> 4);
            output_buffer[2] = ((input_buffer[1] & 0x0f) << 2) + ((input_buffer[2] & 0xc0) >> 6);
            output_buffer[3] = input_buffer[2] & 0x3f;

            for(uint8_t byte : output_buffer)
                encoded += base64_chars[byte];
            i = 0;
        }
    }

    if (i)
    {
        for(size_t j=i ; j < input_buffer.size() ; ++j)
            input_buffer[j] = 0;

        output_buffer[0] = (input_buffer[0] & 0xfc) >> 2;
        output_buffer[1] = ((input_buffer[0] & 0x03) << 4) + ((input_buffer[1] & 0xf0) >> 4);
        output_buffer[2] = ((input_buffer[1] & 0x0f) << 2) + ((input_buffer[2] & 0xc0) >> 6);
        output_buffer[3] = input_buffer[2] & 0x3f;

        for (size_t j=0 ; j<i+1 ; ++j)
            encoded += base64_chars[output_buffer[j]];
    }

    return encoded;
}